

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

VARIABLE_FLAVOUR
gl4cts::GLSL420Pack::Utils::getVariableFlavour
          (SHADER_STAGES stage,VARIABLE_STORAGE storage,qualifierSet *qualifiers)

{
  bool bVar1;
  TestError *this;
  VARIABLE_FLAVOUR local_1c;
  VARIABLE_FLAVOUR result;
  qualifierSet *qualifiers_local;
  VARIABLE_STORAGE storage_local;
  SHADER_STAGES stage_local;
  
  if (storage == UNIFORM) {
    local_1c = BASIC;
  }
  else {
    switch(stage) {
    case VERTEX_SHADER:
    case FRAGMENT_SHADER:
      local_1c = BASIC;
      break;
    case TESS_CTRL_SHADER:
      bVar1 = doesContainQualifier(QUAL_PATCH,qualifiers);
      if ((bVar1) && (storage == OUTPUT)) {
        local_1c = BASIC;
      }
      else {
        local_1c = INDEXED_BY_INVOCATION_ID;
      }
      break;
    case TESS_EVAL_SHADER:
      bVar1 = doesContainQualifier(QUAL_PATCH,qualifiers);
      if ((bVar1) || (storage != INPUT)) {
        local_1c = BASIC;
      }
      else {
        local_1c = ARRAY;
      }
      break;
    case GEOMETRY_SHADER:
      local_1c = (VARIABLE_FLAVOUR)(storage == INPUT);
      break;
    default:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x473);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return local_1c;
}

Assistant:

Utils::VARIABLE_FLAVOUR Utils::getVariableFlavour(SHADER_STAGES stage, VARIABLE_STORAGE storage,
												  const qualifierSet& qualifiers)
{
	VARIABLE_FLAVOUR result;

	if (UNIFORM == storage)
	{
		result = BASIC;
	}
	else
	{
		switch (stage)
		{
		case Utils::GEOMETRY_SHADER:
			if (Utils::INPUT == storage)
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_EVAL_SHADER:
			if ((false == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::INPUT == storage))
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_CTRL_SHADER:
			if ((true == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::OUTPUT == storage))
			{
				result = BASIC;
			}
			else
			{
				result = INDEXED_BY_INVOCATION_ID;
			}
			break;
		case Utils::VERTEX_SHADER:
		case Utils::FRAGMENT_SHADER:
			result = BASIC;
			break;
		default:
			TCU_FAIL("Invliad enum");
			break;
		}
	}

	return result;
}